

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  uint uVar15;
  undefined4 uVar16;
  _func_int *p_Var17;
  size_t sVar18;
  Allocator *pAVar19;
  _func_int **pp_Var20;
  int *piVar21;
  size_t sVar22;
  uint uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  bool bVar26;
  uint num_input;
  int iVar27;
  ulong uVar28;
  long lVar29;
  void *pvVar30;
  ulong uVar31;
  ulong uVar32;
  void *pvVar33;
  ulong uVar34;
  void *pvVar35;
  int j;
  void *pvVar36;
  undefined2 *puVar37;
  int q_1;
  void *pvVar38;
  uint uVar39;
  void *pvVar40;
  void *pvVar41;
  int k;
  undefined4 *puVar42;
  void *pvVar43;
  void *pvVar44;
  int i;
  int iVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  undefined2 *puVar49;
  void *pvVar50;
  int j_2;
  void *pvVar51;
  void *pvVar52;
  int k_2;
  void *pvVar53;
  int p;
  ulong uVar54;
  undefined2 *puVar55;
  long lVar56;
  int p_1;
  long lVar57;
  undefined2 *puVar58;
  byte bVar59;
  byte bVar60;
  float fVar61;
  undefined8 local_c0;
  undefined1 local_b8 [64];
  size_t local_78;
  long local_68;
  uint local_60;
  undefined4 local_5c;
  short sStack_58;
  undefined4 auStack_56 [9];
  
  p_Var17 = this->_vptr_Convolution_x86[-3];
  iVar27 = *(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data);
  iVar45 = *(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data);
  uVar31 = (long)*(int *)(p_Var17 + 0x1c + (long)&(this->weight_winograd43_data).data) /
           (long)(iVar45 * iVar27);
  uVar15 = *(uint *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
  uVar31 = (long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) /
           (long)(int)uVar15;
  uVar28 = uVar31 & 0xffffffff;
  bVar2 = opt->use_packing_layout;
  num_input = (uint)uVar31;
  local_c0 = (void *)(long)(int)num_input;
  if (bVar2 != true) {
    bVar26 = false;
    goto LAB_0018b43b;
  }
  bVar59 = (uVar31 & 7) == 0;
  uVar39 = uVar15 & 3;
  bVar60 = uVar39 != 0;
  uVar23 = num_input & 7;
  bVar26 = (bool)bVar59;
  if ((uVar31 & 7) == 0 && uVar39 == 0) {
    if (((iVar45 == 1 && iVar27 == 1) &&
        (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
          (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
      iVar27 = 1;
      iVar45 = iVar27;
LAB_0018b40a:
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar15,iVar27,iVar45);
    }
    else if ((((opt->use_winograd_convolution == true) &&
              (((iVar45 == 3 && (iVar27 == 3)) && (opt->use_winograd43_convolution != false)))) &&
             (((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
            (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)) {
      local_60 = uVar39;
      local_5c = num_input & 7;
      iVar27 = cpu_support_x86_xop();
      if (iVar27 == 0) {
        local_78 = 0;
        local_b8._0_8_ = (void *)0x0;
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
        local_b8._16_8_ = 0;
        local_b8._24_4_ = 0;
        local_b8._32_8_ = (Allocator *)0x0;
        local_b8._40_4_ = 0;
        local_b8._44_4_ = 0;
        local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar54 = 0;
        Mat::create((Mat *)local_b8,0x24,num_input,uVar15,2,(Allocator *)0x0);
        uVar31 = 0;
        if (0 < (int)num_input) {
          uVar31 = uVar28;
        }
        uVar32 = 0;
        if (0 < (int)uVar15) {
          uVar32 = (ulong)uVar15;
        }
        for (; uVar54 != uVar32; uVar54 = uVar54 + 1) {
          iVar27 = num_input * 9 * (int)uVar54;
          pvVar30 = ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data))->data;
          pvVar51 = (void *)(local_b8._16_8_ * local_78 * uVar54 + local_b8._0_8_);
          for (uVar34 = 0; uVar34 != uVar31; uVar34 = uVar34 + 1) {
            lVar57 = uVar34 * 9;
            cVar3 = *(char *)((long)pvVar30 + lVar57 + iVar27);
            cVar4 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 1);
            cVar5 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 2);
            cVar6 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 3);
            cVar7 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 4);
            cVar8 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 5);
            cVar9 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 6);
            cVar10 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 7);
            cVar11 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 8);
            for (lVar57 = 4; lVar57 != 0x28; lVar57 = lVar57 + 6) {
              sVar12 = *(short *)(&UNK_004c64bc + lVar57);
              sVar13 = *(short *)(&UNK_004c64be + lVar57);
              sVar14 = *(short *)((long)&DAT_004c64c0 + lVar57);
              *(short *)((long)&local_5c + lVar57) =
                   sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
              *(short *)((long)&local_5c + lVar57 + 2) =
                   sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
              *(short *)((long)auStack_56 + lVar57 + -2) =
                   sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
            }
            pvVar33 = pvVar51;
            for (lVar57 = 0; lVar57 != 6; lVar57 = lVar57 + 1) {
              sVar12 = *(short *)((long)auStack_56 + lVar57 * 6 + -2);
              uVar16 = *(undefined4 *)((long)auStack_56 + lVar57 * 6);
              puVar42 = &DAT_004c64c2;
              for (lVar29 = 0; lVar29 != 6; lVar29 = lVar29 + 1) {
                *(short *)((long)pvVar33 + lVar29 * 2) =
                     (short)((uint)*puVar42 >> 0x10) * (short)((uint)uVar16 >> 0x10) +
                     (short)*puVar42 * (short)uVar16 + *(short *)((long)puVar42 + -2) * sVar12;
                puVar42 = (undefined4 *)((long)puVar42 + 6);
              }
              pvVar33 = (void *)((long)pvVar33 + 0xc);
            }
            pvVar51 = (void *)((long)pvVar51 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
          }
        }
        Mat::create(&this->weight_winograd43_data,
                    (int)((long)((ulong)(uint)((int)num_input >> 0x1f) << 0x20 | uVar28) / 8),0x24,
                    (int)uVar15 / 4,0x40,0x20,(Allocator *)0x0);
        lVar29 = local_78 * local_b8._16_8_;
        iVar27 = (this->weight_winograd43_data).w;
        pvVar51 = (this->weight_winograd43_data).data;
        sVar18 = (this->weight_winograd43_data).elemsize;
        sVar22 = (this->weight_winograd43_data).cstep;
        pvVar41 = (void *)(lVar29 * 3 + local_b8._0_8_);
        local_68 = lVar29 * 4;
        lVar57 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
        pvVar30 = (void *)(local_b8._0_8_ + lVar29 * 2);
        pvVar43 = (void *)(lVar29 + local_b8._0_8_);
        pvVar33 = (void *)local_b8._0_8_;
        for (uVar31 = 0; (long)(uVar31 | 3) < (long)(int)uVar15; uVar31 = uVar31 + 4) {
          pvVar35 = pvVar33;
          pvVar40 = pvVar43;
          pvVar44 = pvVar41;
          pvVar52 = pvVar30;
          for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
            lVar47 = (long)pvVar51 +
                     (long)iVar27 * sVar18 * lVar29 + (uVar31 >> 2) * sVar22 * sVar18;
            pvVar36 = pvVar35;
            pvVar38 = pvVar40;
            pvVar50 = pvVar44;
            pvVar53 = pvVar52;
            for (uVar54 = 0; (long)(uVar54 | 7) < (long)local_c0; uVar54 = uVar54 + 8) {
              lVar56 = 0;
              for (lVar48 = 0; lVar48 != 0x40; lVar48 = lVar48 + 8) {
                *(undefined2 *)(lVar47 + lVar48) = *(undefined2 *)((long)pvVar36 + lVar56);
                *(undefined2 *)(lVar47 + lVar48 + 2) = *(undefined2 *)((long)pvVar38 + lVar56);
                *(undefined2 *)(lVar47 + lVar48 + 4) = *(undefined2 *)((long)pvVar53 + lVar56);
                *(undefined2 *)(lVar47 + lVar48 + 6) = *(undefined2 *)((long)pvVar50 + lVar56);
                lVar56 = lVar56 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
              }
              pvVar50 = (void *)((long)pvVar50 + lVar57);
              pvVar53 = (void *)((long)pvVar53 + lVar57);
              pvVar38 = (void *)((long)pvVar38 + lVar57);
              pvVar36 = (void *)((long)pvVar36 + lVar57);
              lVar47 = lVar47 + 0x40;
            }
            pvVar44 = (void *)((long)pvVar44 + 2);
            pvVar52 = (void *)((long)pvVar52 + 2);
            pvVar40 = (void *)((long)pvVar40 + 2);
            pvVar35 = (void *)((long)pvVar35 + 2);
          }
          pvVar41 = (void *)((long)pvVar41 + local_68);
          pvVar30 = (void *)((long)pvVar30 + local_68);
          pvVar43 = (void *)((long)pvVar43 + local_68);
          pvVar33 = (void *)((long)pvVar33 + local_68);
        }
        piVar21 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
        uVar39 = local_60;
        uVar23 = local_5c;
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
              free((void *)local_b8._0_8_);
              uVar39 = local_60;
              uVar23 = local_5c;
            }
            else {
              (*(*(_func_int ***)local_b8._32_8_)[3])();
              uVar39 = local_60;
              uVar23 = local_5c;
            }
          }
        }
        goto LAB_0018b1fa;
      }
      conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_winograd43_data,num_input,uVar15,opt);
    }
    else {
      if (opt->use_sgemm_convolution == true) goto LAB_0018b40a;
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,uVar15,iVar27,iVar45,8,4);
    }
LAB_0018b43b:
    bVar60 = bVar2 ^ 1;
    bVar59 = bVar2;
  }
  else {
LAB_0018b1fa:
    if ((uVar39 == 0) && (uVar23 != 0)) {
      p_Var17 = this->_vptr_Convolution_x86[-3];
      iVar27 = *(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data);
      if (iVar27 == 7) {
        if ((((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 7) ||
             (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) != 2))))
        goto LAB_0018ba96;
        iVar45 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar27 = 7;
        iVar46 = iVar27;
      }
      else if (iVar27 == 3) {
        if ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3) ||
           ((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) != 1)))) &&
            ((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) != 2))))))
        goto LAB_0018ba96;
        iVar45 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar27 = 3;
        iVar46 = iVar27;
      }
      else if (((iVar27 == 1) &&
               (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              ((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)) ||
               ((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
        iVar45 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar27 = 1;
        iVar46 = iVar27;
      }
      else {
LAB_0018ba96:
        iVar45 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar46 = *(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,iVar45,iVar27,iVar46,1,4);
          goto LAB_0018bb60;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar45,iVar27,iVar46);
      goto LAB_0018bb60;
    }
  }
  if ((bVar60 != 0) && (bVar26)) {
    p_Var17 = this->_vptr_Convolution_x86[-3];
    iVar27 = *(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar27 == 1) &&
        (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)) ||
        ((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data),1,1);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar27 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
               (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
            ((*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             ((*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)))))) {
      uVar15 = *(uint *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar27 = cpu_support_x86_xop();
      if (iVar27 == 0) {
        local_78 = 0;
        local_b8._0_8_ = (void *)0x0;
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
        local_b8._16_8_ = 0;
        local_b8._24_4_ = 0;
        local_b8._32_8_ = (Allocator *)0x0;
        local_b8._40_4_ = 0;
        local_b8._44_4_ = 0;
        local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar54 = 0;
        Mat::create((Mat *)local_b8,0x24,num_input,uVar15,2,(Allocator *)0x0);
        uVar31 = 0;
        if (0 < (int)num_input) {
          uVar31 = uVar28;
        }
        uVar32 = 0;
        if (0 < (int)uVar15) {
          uVar32 = (ulong)uVar15;
        }
        for (; uVar54 != uVar32; uVar54 = uVar54 + 1) {
          iVar27 = num_input * 9 * (int)uVar54;
          pvVar30 = ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data))->data;
          pvVar51 = (void *)(local_b8._16_8_ * local_78 * uVar54 + local_b8._0_8_);
          for (uVar34 = 0; uVar34 != uVar31; uVar34 = uVar34 + 1) {
            lVar57 = uVar34 * 9;
            cVar3 = *(char *)((long)pvVar30 + lVar57 + iVar27);
            cVar4 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 1);
            cVar5 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 2);
            cVar6 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 3);
            cVar7 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 4);
            cVar8 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 5);
            cVar9 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 6);
            cVar10 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 7);
            cVar11 = *(char *)((long)pvVar30 + lVar57 + (long)iVar27 + 8);
            for (lVar57 = 4; lVar57 != 0x28; lVar57 = lVar57 + 6) {
              sVar12 = *(short *)(&UNK_004c64bc + lVar57);
              sVar13 = *(short *)(&UNK_004c64be + lVar57);
              sVar14 = *(short *)((long)&DAT_004c64c0 + lVar57);
              *(short *)((long)&local_5c + lVar57) =
                   sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
              *(short *)((long)&local_5c + lVar57 + 2) =
                   sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
              *(short *)((long)auStack_56 + lVar57 + -2) =
                   sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
            }
            pvVar33 = pvVar51;
            for (lVar57 = 0; lVar57 != 6; lVar57 = lVar57 + 1) {
              sVar12 = *(short *)((long)auStack_56 + lVar57 * 6 + -2);
              uVar16 = *(undefined4 *)((long)auStack_56 + lVar57 * 6);
              puVar42 = &DAT_004c64c2;
              for (lVar29 = 0; lVar29 != 6; lVar29 = lVar29 + 1) {
                *(short *)((long)pvVar33 + lVar29 * 2) =
                     (short)((uint)*puVar42 >> 0x10) * (short)((uint)uVar16 >> 0x10) +
                     (short)*puVar42 * (short)uVar16 + *(short *)((long)puVar42 + -2) * sVar12;
                puVar42 = (undefined4 *)((long)puVar42 + 6);
              }
              pvVar33 = (void *)((long)pvVar33 + 0xc);
            }
            pvVar51 = (void *)((long)pvVar51 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
          }
        }
        Mat::create(&this->weight_winograd43_data,num_input,0x24,((int)uVar15 / 4) * -3 + uVar15,8,4
                    ,(Allocator *)0x0);
        lVar29 = local_78 * local_b8._16_8_;
        iVar27 = (this->weight_winograd43_data).w;
        pvVar51 = (this->weight_winograd43_data).data;
        sVar18 = (this->weight_winograd43_data).elemsize;
        sVar22 = (this->weight_winograd43_data).cstep;
        pvVar43 = (void *)(lVar29 * 3 + local_b8._0_8_);
        local_68 = lVar29 * 4;
        lVar57 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
        pvVar30 = (void *)(local_b8._0_8_ + lVar29 * 2);
        pvVar41 = (void *)(lVar29 + local_b8._0_8_);
        pvVar33 = (void *)local_b8._0_8_;
        for (uVar31 = 0; (long)(uVar31 | 3) < (long)(int)uVar15; uVar31 = uVar31 + 4) {
          pvVar35 = pvVar30;
          pvVar40 = pvVar41;
          pvVar44 = pvVar43;
          pvVar52 = pvVar33;
          for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
            lVar47 = (long)pvVar51 +
                     (long)iVar27 * sVar18 * lVar29 + (uVar31 >> 2) * sVar22 * sVar18;
            pvVar36 = pvVar52;
            pvVar38 = pvVar40;
            pvVar50 = pvVar44;
            pvVar53 = pvVar35;
            for (uVar54 = 0; (long)(uVar54 | 7) < (long)local_c0; uVar54 = uVar54 + 8) {
              lVar56 = 0;
              for (lVar48 = 0; lVar48 != 0x40; lVar48 = lVar48 + 8) {
                *(undefined2 *)(lVar47 + lVar48) = *(undefined2 *)((long)pvVar36 + lVar56);
                *(undefined2 *)(lVar47 + lVar48 + 2) = *(undefined2 *)((long)pvVar38 + lVar56);
                *(undefined2 *)(lVar47 + lVar48 + 4) = *(undefined2 *)((long)pvVar53 + lVar56);
                *(undefined2 *)(lVar47 + lVar48 + 6) = *(undefined2 *)((long)pvVar50 + lVar56);
                lVar56 = lVar56 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
              }
              pvVar50 = (void *)((long)pvVar50 + lVar57);
              pvVar53 = (void *)((long)pvVar53 + lVar57);
              pvVar38 = (void *)((long)pvVar38 + lVar57);
              pvVar36 = (void *)((long)pvVar36 + lVar57);
              lVar47 = lVar47 + 0x40;
            }
            pvVar44 = (void *)((long)pvVar44 + 2);
            pvVar35 = (void *)((long)pvVar35 + 2);
            pvVar40 = (void *)((long)pvVar40 + 2);
            pvVar52 = (void *)((long)pvVar52 + 2);
          }
          pvVar43 = (void *)((long)pvVar43 + local_68);
          pvVar30 = (void *)((long)pvVar30 + local_68);
          pvVar41 = (void *)((long)pvVar41 + local_68);
          pvVar33 = (void *)((long)pvVar33 + local_68);
        }
        iVar27 = (this->weight_winograd43_data).w;
        pvVar30 = (this->weight_winograd43_data).data;
        sVar18 = (this->weight_winograd43_data).elemsize;
        sVar22 = (this->weight_winograd43_data).cstep;
        puVar37 = (undefined2 *)(local_b8._16_8_ * local_78 * uVar31 + local_b8._0_8_);
        for (; (long)uVar31 < (long)(int)uVar15; uVar31 = uVar31 + 1) {
          puVar49 = puVar37;
          for (lVar57 = 0; lVar57 != 0x24; lVar57 = lVar57 + 1) {
            lVar29 = (long)pvVar30 +
                     (long)iVar27 * sVar18 * lVar57 +
                     (ulong)(((uint)uVar31 & 3) + ((uint)(uVar31 >> 2) & 0x3fffffff)) *
                     sVar22 * sVar18;
            puVar58 = puVar49;
            for (uVar54 = 0; (long)(uVar54 | 7) < (long)local_c0; uVar54 = uVar54 + 8) {
              puVar55 = puVar58;
              for (lVar47 = 0; lVar47 != 0x10; lVar47 = lVar47 + 2) {
                *(undefined2 *)(lVar29 + lVar47) = *puVar55;
                puVar55 = (undefined2 *)
                          ((long)puVar55 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
              }
              puVar58 = puVar58 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
              lVar29 = lVar29 + 0x10;
            }
            puVar49 = puVar49 + 1;
          }
          puVar37 = (undefined2 *)((long)puVar37 + local_b8._16_8_ * local_78);
        }
        piVar21 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
              free((void *)local_b8._0_8_);
            }
            else {
              (*(*(_func_int ***)local_b8._32_8_)[3])();
            }
          }
        }
      }
      else {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
                  ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                   &this->weight_winograd43_data,num_input,uVar15,opt);
      }
    }
    else if (opt->use_sgemm_convolution == true) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data),iVar27,
                 *(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data));
    }
    else {
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,
                 *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data),iVar27,
                 *(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data),8,1);
    }
  }
  if ((bVar60 & (bVar59 ^ 1)) == 1) {
    p_Var17 = this->_vptr_Convolution_x86[-3];
    iVar27 = *(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar27 == 1) &&
        (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
         (((*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar46 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar45 = 1;
      iVar27 = iVar45;
    }
    else {
      if ((((opt->use_winograd_convolution == true) && (iVar27 == 3)) &&
          (((opt->use_winograd23_convolution != false &&
            (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var17 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var17 + (long)&(this->weight_winograd43_data).data) == 1)))))) &&
         (0xf < (int)num_input)) {
        iVar45 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        if (0xf < (long)iVar45) {
          Mat::create(&this->weight_winograd23_data,0x10,num_input,iVar45,2,(Allocator *)0x0);
          for (lVar57 = 0; lVar57 != iVar45; lVar57 = lVar57 + 1) {
            lVar29 = (long)(int)(num_input * 9 * (int)lVar57) +
                     *(long *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
            iVar27 = (this->weight_winograd23_data).w;
            sVar18 = (this->weight_winograd23_data).elemsize;
            pvVar30 = (void *)(sVar18 * (this->weight_winograd23_data).cstep * lVar57 +
                              (long)(this->weight_winograd23_data).data);
            for (uVar31 = 0; pvVar51 = pvVar30, uVar31 != uVar28; uVar31 = uVar31 + 1) {
              lVar47 = uVar31 * 9;
              cVar3 = *(char *)(lVar29 + lVar47);
              cVar4 = *(char *)(lVar29 + 1 + lVar47);
              cVar5 = *(char *)(lVar29 + 2 + lVar47);
              cVar6 = *(char *)(lVar29 + 3 + lVar47);
              cVar7 = *(char *)(lVar29 + 4 + lVar47);
              cVar8 = *(char *)(lVar29 + 5 + lVar47);
              cVar9 = *(char *)(lVar29 + 6 + lVar47);
              cVar10 = *(char *)(lVar29 + 7 + lVar47);
              cVar11 = *(char *)(lVar29 + 8 + lVar47);
              for (lVar47 = 4; lVar47 != 0x1c; lVar47 = lVar47 + 6) {
                sVar12 = *(short *)(&UNK_004c64ec + lVar47);
                sVar13 = *(short *)(&UNK_004c64ee + lVar47);
                sVar14 = *(short *)((long)&DAT_004c64f0 + lVar47);
                *(short *)((long)&local_c0 + lVar47 + 4) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_c0 + lVar47 + 6) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)(local_b8 + lVar47) = sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar30 = pvVar51;
              for (lVar47 = 0; lVar47 != 4; lVar47 = lVar47 + 1) {
                sVar12 = *(short *)(local_b8 + lVar47 * 6);
                uVar16 = *(undefined4 *)(local_b8 + lVar47 * 6 + 2);
                puVar42 = &DAT_004c64f2;
                for (lVar48 = 0; lVar48 != 4; lVar48 = lVar48 + 1) {
                  *(short *)((long)pvVar30 + lVar48 * 2) =
                       (short)((uint)*puVar42 >> 0x10) * (short)((uint)uVar16 >> 0x10) +
                       (short)*puVar42 * (short)uVar16 + *(short *)((long)puVar42 + -2) * sVar12;
                  puVar42 = (undefined4 *)((long)puVar42 + 6);
                }
                pvVar30 = (void *)((long)pvVar30 + 8);
              }
              pvVar30 = (void *)((long)pvVar51 + (long)iVar27 * sVar18);
              local_c0 = pvVar51;
            }
          }
          goto LAB_0018bb60;
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var17 != (_func_int *)0xfffffffffffffeb0) {
          piVar21 = *(int **)(p_Var17 + 0x38 + (long)&(this->weight_winograd63_data).data);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + 1;
            UNLOCK();
          }
          piVar21 = (this->weight_data_tm).refcount;
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              pAVar19 = (this->weight_data_tm).allocator;
              if (pAVar19 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar19->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined1 (*) [16])((long)&(this->weight_data_tm).refcount + 4) = (undefined1  [16])0x0
          ;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data + 8);
          (this->weight_data_tm).data =
               *(void **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).refcount = piVar21;
          (this->weight_data_tm).elemsize =
               *(size_t *)(p_Var17 + 0x40 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).elempack =
               *(int *)((long)&this->convolution_dilation1 + (long)p_Var17);
          (this->weight_data_tm).allocator =
               *(Allocator **)(p_Var17 + (long)&(this->scale_in_data).data);
          uVar24 = *(undefined8 *)(p_Var17 + 8 + (long)&(this->scale_in_data).data);
          uVar25 = *(undefined8 *)(p_Var17 + 8 + (long)&(this->scale_in_data).data + 8);
          (this->weight_data_tm).dims = (int)uVar24;
          (this->weight_data_tm).w = (int)((ulong)uVar24 >> 0x20);
          (this->weight_data_tm).h = (int)uVar25;
          (this->weight_data_tm).d = (int)((ulong)uVar25 >> 0x20);
          (this->weight_data_tm).c = *(int *)(p_Var17 + 0x18 + (long)&(this->scale_in_data).data);
          (this->weight_data_tm).cstep =
               *(size_t *)(p_Var17 + 0x20 + (long)&(this->scale_in_data).data);
        }
        goto LAB_0018bb60;
      }
      iVar46 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar45 = *(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data);
    }
    convolution_im2col_sgemm_transform_kernel_int8_sse
              ((Mat *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,num_input,iVar46,iVar27,iVar45);
  }
LAB_0018bb60:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var20 = this->_vptr_Convolution_x86;
  pvVar30 = (this->scale_in_data).data;
  for (lVar57 = 0; p_Var17 = pp_Var20[-3],
      lVar57 < *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
      lVar57 = lVar57 + 1) {
    fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var17) + lVar57 * 4);
    fVar61 = 0.0;
    if (fVar1 != 0.0) {
      fVar61 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var17));
    }
    *(float *)((long)pvVar30 + lVar57 * 4) = fVar61;
  }
  if (opt->lightmode != false) {
    piVar21 = *(int **)(p_Var17 + 0x38 + (long)&(this->weight_winograd63_data).data);
    if (piVar21 != (int *)0x0) {
      LOCK();
      *piVar21 = *piVar21 + -1;
      UNLOCK();
      if (*piVar21 == 0) {
        if (*(long **)(p_Var17 + (long)&(this->scale_in_data).data) == (long *)0x0) {
          free(*(void **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data));
        }
        else {
          (**(code **)(**(long **)(p_Var17 + (long)&(this->scale_in_data).data) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var17 + 0x20 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 8 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var17 + 0x18 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}